

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeaderStructs.cpp
# Opt level: O2

istream * operator>>(istream *stream,ChunkHeader *header)

{
  MaskRectRaw *pMVar1;
  MaskRectRaw MVar2;
  MaskRect *mask;
  MaskRectRaw *pMVar3;
  ChunkHeaderRaw h;
  ChunkHeaderRaw local_34;
  
  readRaw<ChunkHeaderRaw>(&local_34,stream);
  header->type = (Type)local_34.type.value_;
  std::vector<MaskRect,_std::allocator<MaskRect>_>::resize
            (&header->masks,(ulong)(ushort)local_34.masks.value_);
  std::vector<MaskRect,_std::allocator<MaskRect>_>::resize
            (&header->transparentMasks,(ulong)(ushort)local_34.transparentMasks.value_);
  header->alignmentWords = (uint16_t)local_34.alignmentWords.value_;
  header->x = (uint16_t)local_34.x.value_;
  header->y = (uint16_t)local_34.y.value_;
  header->w = (uint16_t)local_34.w.value_;
  header->h = (uint16_t)local_34.h.value_;
  header->size = (uint32_t)local_34.size.value_;
  pMVar1 = (MaskRectRaw *)
           (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pMVar3 = (MaskRectRaw *)
                (header->masks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    MVar2 = readRaw<MaskRectRaw>(stream);
    *pMVar3 = MVar2;
  }
  pMVar1 = (MaskRectRaw *)
           (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pMVar3 = (MaskRectRaw *)
                (header->transparentMasks).super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                _M_impl.super__Vector_impl_data._M_start; pMVar3 != pMVar1; pMVar3 = pMVar3 + 1) {
    MVar2 = readRaw<MaskRectRaw>(stream);
    *pMVar3 = MVar2;
  }
  std::istream::ignore((long)stream);
  return stream;
}

Assistant:

std::istream& operator>>(std::istream& stream, ChunkHeader& header) {
	auto h = readRaw<ChunkHeaderRaw>(stream);
	header.type = static_cast<ChunkHeader::Type>(h.type.value());
	header.masks.resize(h.masks.value());
	header.transparentMasks.resize(h.transparentMasks.value());
	header.alignmentWords = h.alignmentWords.value();
	header.x = h.x.value();
	header.y = h.y.value();
	header.w = h.w.value();
	header.h = h.h.value();
	header.size = h.size.value();
	for (auto& mask : header.masks) {
		mask = readRaw<MaskRectRaw>(stream);
	}
	for (auto& tmask : header.transparentMasks) {
		tmask = readRaw<MaskRectRaw>(stream);
	}
	stream.ignore(header.alignmentWords * 2);
	return stream;
}